

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestSuiteEnd(StreamingListener *this,TestSuite *test_suite)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  TimeInMillis local_30;
  
  bVar2 = TestSuite::Passed(test_suite);
  pcVar7 = "0";
  if (bVar2) {
    pcVar7 = "1";
  }
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "";
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar7,pcVar6);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_50,0,0,"event=TestCaseEnd&passed=",0x19);
  local_90._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar4) {
    local_90.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_90,"&elapsed_time=");
  paVar4 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar5) {
    local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_d0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_30 = test_suite->elapsed_time_;
  StreamableToString<long>(&local_b0,&local_30);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar4) {
    uVar8 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_b0._M_string_length + local_d0._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar8 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_d0._M_string_length <= (ulong)uVar8) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_b0,0,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      goto LAB_0013477c;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
LAB_0013477c:
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar1 == paVar5) {
    local_f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  local_f0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f0,"ms");
  local_70._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar5) {
    local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  AbstractSocketWriter::SendLn
            ((this->socket_writer_)._M_t.
             super___uniq_ptr_impl<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             .
             super__Head_base<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_false>
             ._M_head_impl,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar4) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OnTestSuiteEnd(const TestSuite& test_suite) override {
    SendLn("event=TestCaseEnd&passed=" + FormatBool(test_suite.Passed()) +
           "&elapsed_time=" + StreamableToString(test_suite.elapsed_time()) +
           "ms");
  }